

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

bool __thiscall S2Builder::EdgeChainSimplifier::IsInterior(EdgeChainSimplifier *this,VertexId v)

{
  int iVar1;
  int v_00;
  pointer piVar2;
  pointer piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer ppVar4;
  bool bVar5;
  ulong uVar6;
  int *piVar7;
  Iterator __begin1;
  int iVar8;
  long lVar9;
  int *piVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  bool bVar11;
  InteriorVertexMatcher matcher;
  
  piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = piVar2[v];
  iVar1 = piVar2[(long)v + 1];
  if (((iVar1 == iVar8) ||
      (piVar2 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start, iVar1 - iVar8 != piVar2[(long)v + 1] - piVar2[v]))
     || (v < this->builder_->num_forced_sites_)) {
    bVar11 = false;
  }
  else {
    piVar2 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    for (; iVar1 != iVar8; iVar8 = iVar8 + 1) {
      matcher.v0_ = iVar8;
      std::vector<int,_std::allocator<int>_>::push_back(&this->tmp_edges_,&matcher.v0_);
    }
    piVar2 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = piVar3[(long)v + 1];
    for (lVar9 = (long)piVar3[v] << 2; (long)iVar8 * 4 != lVar9; lVar9 = lVar9 + 4) {
      matcher.v0_ = *(VertexId *)((long)piVar2 + lVar9);
      std::vector<int,_std::allocator<int>_>::push_back(&this->tmp_edges_,&matcher.v0_);
    }
    __first._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar6 = (long)__last._M_current - (long)__first._M_current >> 2;
      lVar9 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                (__first,__last,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                  )this);
      if ((long)__last._M_current - (long)__first._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                      )this);
        }
      }
    }
    matcher.v1_ = -1;
    matcher.v2_ = -1;
    matcher.too_many_endpoints_ = false;
    piVar10 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    matcher.v0_ = v;
    do {
      piVar7 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar11 = piVar10 == piVar7;
      if (bVar11) {
        return bVar11;
      }
      iVar8 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar10];
      matcher.n0_ = 0;
      matcher.n1_ = 0;
      matcher.n2_ = 0;
      matcher.excess_out_ = 0;
      while ((piVar10 != piVar7 &&
             (iVar1 = *piVar10,
             (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1] == iVar8))) {
        ppVar4 = (this->g_->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        v_00 = ppVar4[iVar1].first;
        iVar1 = ppVar4[iVar1].second;
        if (v_00 == v) {
          InteriorVertexMatcher::Tally(&matcher,iVar1,true);
        }
        if (iVar1 == v) {
          InteriorVertexMatcher::Tally(&matcher,v_00,false);
        }
        piVar10 = piVar10 + 1;
        piVar7 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      bVar5 = InteriorVertexMatcher::Matches(&matcher);
    } while (bVar5);
  }
  return bVar11;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}